

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O1

void embree::sse2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse2::ArrayIntersectorK_1<4,_embree::sse2::ObjectIntersectorK<4,_false>_>,_false>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  StackItemT<embree::NodeRefPtr<4>_> *pSVar1;
  float *pfVar2;
  float fVar3;
  StackItemT<embree::NodeRefPtr<4>_> SVar4;
  int iVar5;
  AccelData *pAVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  bool bVar11;
  undefined4 in_EAX;
  uint uVar12;
  undefined4 uVar13;
  ulong uVar14;
  ulong uVar15;
  Geometry *pGVar16;
  ulong uVar17;
  _func_int **pp_Var18;
  ulong uVar19;
  ulong uVar20;
  Geometry *pGVar21;
  ulong uVar22;
  size_t sVar23;
  ulong uVar24;
  ulong uVar25;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  undefined1 auVar31 [12];
  float fVar41;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar42;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [12];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  uint uVar63;
  undefined1 auVar62 [16];
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [12];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined4 uVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar92;
  undefined1 auVar93 [12];
  undefined1 auVar94 [12];
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar108 [12];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar128;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  vint<4> octant;
  undefined1 local_11c8 [8];
  float fStack_11c0;
  float fStack_11bc;
  RTCIntersectFunctionNArguments local_11b8;
  Geometry *local_1188;
  undefined8 local_1180;
  RTCIntersectArguments *local_1178;
  float local_1168;
  float fStack_1164;
  float fStack_1160;
  float fStack_115c;
  undefined1 local_1158 [16];
  vfloat<4> fmin;
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  float local_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  undefined1 local_1048 [16];
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  undefined1 local_1028 [8];
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  undefined1 local_fa8 [16];
  undefined1 local_f98 [8];
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 auVar82 [16];
  undefined1 auVar115 [16];
  
  auVar113._8_4_ = 0xffffffff;
  auVar113._0_8_ = 0xffffffffffffffff;
  auVar113._12_4_ = 0xffffffff;
  auVar33._0_4_ = -(uint)((valid_i->field_0).i[0] == -1);
  auVar33._4_4_ = -(uint)((valid_i->field_0).i[1] == -1);
  auVar33._8_4_ = -(uint)((valid_i->field_0).i[2] == -1);
  auVar33._12_4_ = -(uint)((valid_i->field_0).i[3] == -1);
  uVar12 = movmskps(in_EAX,auVar33);
  if (uVar12 == 0) {
    return;
  }
  pAVar6 = This->ptr;
  uVar17 = (ulong)(uVar12 & 0xff);
  fVar140 = *(float *)ray;
  fVar141 = *(float *)(ray + 4);
  fVar142 = *(float *)(ray + 8);
  fVar143 = *(float *)(ray + 0xc);
  fVar144 = *(float *)(ray + 0x10);
  fVar145 = *(float *)(ray + 0x14);
  fVar146 = *(float *)(ray + 0x18);
  fVar147 = *(float *)(ray + 0x1c);
  fVar148 = *(float *)(ray + 0x20);
  fVar149 = *(float *)(ray + 0x24);
  fVar150 = *(float *)(ray + 0x28);
  fVar151 = *(float *)(ray + 0x2c);
  fVar42 = *(float *)(ray + 0x40);
  fVar41 = *(float *)(ray + 0x44);
  fVar64 = *(float *)(ray + 0x48);
  fVar3 = *(float *)(ray + 0x4c);
  fVar92 = (float)DAT_01ff1d40;
  fVar105 = DAT_01ff1d40._4_4_;
  fVar106 = DAT_01ff1d40._8_4_;
  fVar107 = DAT_01ff1d40._12_4_;
  auVar98._0_4_ = (uint)fVar42 & -(uint)(fVar92 <= ABS(fVar42));
  auVar98._4_4_ = (uint)fVar41 & -(uint)(fVar105 <= ABS(fVar41));
  auVar98._8_4_ = (uint)fVar64 & -(uint)(fVar106 <= ABS(fVar64));
  auVar98._12_4_ = (uint)fVar3 & -(uint)(fVar107 <= ABS(fVar3));
  auVar77._0_4_ = ~-(uint)(fVar92 <= ABS(fVar42)) & (uint)fVar92;
  auVar77._4_4_ = ~-(uint)(fVar105 <= ABS(fVar41)) & (uint)fVar105;
  auVar77._8_4_ = ~-(uint)(fVar106 <= ABS(fVar64)) & (uint)fVar106;
  auVar77._12_4_ = ~-(uint)(fVar107 <= ABS(fVar3)) & (uint)fVar107;
  auVar77 = auVar77 | auVar98;
  uVar12 = -(uint)(fVar92 <= ABS(*(float *)(ray + 0x50)));
  uVar28 = -(uint)(fVar105 <= ABS(*(float *)(ray + 0x54)));
  uVar29 = -(uint)(fVar106 <= ABS(*(float *)(ray + 0x58)));
  uVar30 = -(uint)(fVar107 <= ABS(*(float *)(ray + 0x5c)));
  auVar109._0_4_ = (uint)*(float *)(ray + 0x50) & uVar12;
  auVar109._4_4_ = (uint)*(float *)(ray + 0x54) & uVar28;
  auVar109._8_4_ = (uint)*(float *)(ray + 0x58) & uVar29;
  auVar109._12_4_ = (uint)*(float *)(ray + 0x5c) & uVar30;
  auVar85._0_4_ = ~uVar12 & (uint)fVar92;
  auVar85._4_4_ = ~uVar28 & (uint)fVar105;
  auVar85._8_4_ = ~uVar29 & (uint)fVar106;
  auVar85._12_4_ = ~uVar30 & (uint)fVar107;
  auVar85 = auVar85 | auVar109;
  uVar12 = -(uint)(fVar92 <= ABS(*(float *)(ray + 0x60)));
  uVar28 = -(uint)(fVar105 <= ABS(*(float *)(ray + 100)));
  uVar29 = -(uint)(fVar106 <= ABS(*(float *)(ray + 0x68)));
  uVar30 = -(uint)(fVar107 <= ABS(*(float *)(ray + 0x6c)));
  auVar110._0_4_ = (uint)*(float *)(ray + 0x60) & uVar12;
  auVar110._4_4_ = (uint)*(float *)(ray + 100) & uVar28;
  auVar110._8_4_ = (uint)*(float *)(ray + 0x68) & uVar29;
  auVar110._12_4_ = (uint)*(float *)(ray + 0x6c) & uVar30;
  auVar65._0_4_ = ~uVar12 & (uint)fVar92;
  auVar65._4_4_ = ~uVar28 & (uint)fVar105;
  auVar65._8_4_ = ~uVar29 & (uint)fVar106;
  auVar65._12_4_ = ~uVar30 & (uint)fVar107;
  auVar65 = auVar65 | auVar110;
  auVar95 = rcpps(_DAT_01ff1d40,auVar77);
  fVar152 = auVar95._0_4_;
  auVar132._0_4_ = auVar77._0_4_ * fVar152;
  fVar153 = auVar95._4_4_;
  auVar132._4_4_ = auVar77._4_4_ * fVar153;
  fVar154 = auVar95._8_4_;
  auVar132._8_4_ = auVar77._8_4_ * fVar154;
  fVar155 = auVar95._12_4_;
  auVar132._12_4_ = auVar77._12_4_ * fVar155;
  fVar152 = (1.0 - auVar132._0_4_) * fVar152 + fVar152;
  fVar153 = (1.0 - auVar132._4_4_) * fVar153 + fVar153;
  fVar154 = (1.0 - auVar132._8_4_) * fVar154 + fVar154;
  fVar155 = (1.0 - auVar132._12_4_) * fVar155 + fVar155;
  auVar95 = rcpps(auVar132,auVar85);
  fVar128 = auVar95._0_4_;
  fVar135 = auVar95._4_4_;
  fVar136 = auVar95._8_4_;
  fVar137 = auVar95._12_4_;
  fVar128 = (1.0 - auVar85._0_4_ * fVar128) * fVar128 + fVar128;
  fVar135 = (1.0 - auVar85._4_4_ * fVar135) * fVar135 + fVar135;
  fVar136 = (1.0 - auVar85._8_4_ * fVar136) * fVar136 + fVar136;
  fVar137 = (1.0 - auVar85._12_4_ * fVar137) * fVar137 + fVar137;
  auVar95 = rcpps(auVar95,auVar65);
  fVar92 = auVar95._0_4_;
  fVar105 = auVar95._4_4_;
  fVar106 = auVar95._8_4_;
  fVar107 = auVar95._12_4_;
  fVar92 = (1.0 - auVar65._0_4_ * fVar92) * fVar92 + fVar92;
  fVar105 = (1.0 - auVar65._4_4_ * fVar105) * fVar105 + fVar105;
  fVar106 = (1.0 - auVar65._8_4_ * fVar106) * fVar106 + fVar106;
  fVar107 = (1.0 - auVar65._12_4_ * fVar107) * fVar107 + fVar107;
  auVar86._0_12_ = ZEXT812(0);
  auVar86._12_4_ = 0;
  local_10a8 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar86);
  local_10b8 = maxps(*(undefined1 (*) [16])(ray + 0x80),auVar86);
  auVar95._0_8_ = CONCAT44(-(uint)(fVar41 < 0.0),-(uint)(fVar42 < 0.0)) & 0x100000001;
  auVar95._8_4_ = -(uint)(fVar64 < 0.0) & 1;
  auVar95._12_4_ = -(uint)(fVar3 < 0.0) & 1;
  auVar119._0_8_ =
       CONCAT44(-(uint)(*(float *)(ray + 0x54) < 0.0),-(uint)(*(float *)(ray + 0x50) < 0.0)) &
       0x200000002;
  auVar119._8_4_ = -(uint)(*(float *)(ray + 0x58) < 0.0) & 2;
  auVar119._12_4_ = -(uint)(*(float *)(ray + 0x5c) < 0.0) & 2;
  auVar78._0_8_ =
       CONCAT44(-(uint)(*(float *)(ray + 100) < 0.0),-(uint)(*(float *)(ray + 0x60) < 0.0)) &
       0x400000004;
  auVar78._8_4_ = -(uint)(*(float *)(ray + 0x68) < 0.0) & 4;
  auVar78._12_4_ = -(uint)(*(float *)(ray + 0x6c) < 0.0) & 4;
  local_10c8 = auVar33 ^ auVar113 | auVar95 | auVar78 | auVar119;
  local_1058 = fVar140;
  fStack_1054 = fVar141;
  fStack_1050 = fVar142;
  fStack_104c = fVar143;
  local_1068 = fVar144;
  fStack_1064 = fVar145;
  fStack_1060 = fVar146;
  fStack_105c = fVar147;
  local_1078 = fVar148;
  fStack_1074 = fVar149;
  fStack_1070 = fVar150;
  fStack_106c = fVar151;
  local_1088 = fVar92;
  fStack_1084 = fVar105;
  fStack_1080 = fVar106;
  fStack_107c = fVar107;
  local_1098 = fVar152;
  fStack_1094 = fVar153;
  fStack_1090 = fVar154;
  fStack_108c = fVar155;
  local_11b8.context = (RTCRayQueryContext *)pAVar6;
  auVar33 = _DAT_01feb9f0;
LAB_0020e681:
  lVar7 = 0;
  if (uVar17 != 0) {
    for (; (uVar17 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
    }
  }
  iVar5 = *(int *)(local_10c8 + lVar7 * 4);
  auVar111._0_4_ = -(uint)(iVar5 == local_10c8._0_4_);
  auVar111._4_4_ = -(uint)(iVar5 == local_10c8._4_4_);
  auVar111._8_4_ = -(uint)(iVar5 == local_10c8._8_4_);
  auVar111._12_4_ = -(uint)(iVar5 == local_10c8._12_4_);
  uVar13 = movmskps((int)lVar7,auVar111);
  auVar53._0_4_ = ~auVar111._0_4_ & auVar33._0_4_;
  auVar53._4_4_ = ~auVar111._4_4_ & auVar33._4_4_;
  auVar53._8_4_ = ~auVar111._8_4_ & auVar33._8_4_;
  auVar53._12_4_ = ~auVar111._12_4_ & auVar33._12_4_;
  auVar43._0_8_ = CONCAT44((uint)fVar153 & auVar111._4_4_,(uint)fVar152 & auVar111._0_4_);
  auVar43._8_4_ = (uint)fVar154 & auVar111._8_4_;
  auVar43._12_4_ = (uint)fVar155 & auVar111._12_4_;
  auVar66._8_4_ = auVar43._8_4_;
  auVar66._0_8_ = auVar43._0_8_;
  auVar66._12_4_ = auVar43._12_4_;
  auVar66 = auVar66 | auVar53;
  auVar32._4_4_ = auVar66._0_4_;
  auVar32._0_4_ = auVar66._4_4_;
  auVar32._8_4_ = auVar66._12_4_;
  auVar32._12_4_ = auVar66._8_4_;
  auVar33 = minps(auVar32,auVar66);
  auVar79._0_8_ = CONCAT44((uint)fVar135 & auVar111._4_4_,(uint)fVar128 & auVar111._0_4_);
  auVar79._8_4_ = (uint)fVar136 & auVar111._8_4_;
  auVar79._12_4_ = (uint)fVar137 & auVar111._12_4_;
  auVar67._8_4_ = auVar79._8_4_;
  auVar67._0_8_ = auVar79._0_8_;
  auVar67._12_4_ = auVar79._12_4_;
  auVar67 = auVar67 | auVar53;
  auVar87._4_4_ = auVar67._0_4_;
  auVar87._0_4_ = auVar67._4_4_;
  auVar87._8_4_ = auVar67._12_4_;
  auVar87._12_4_ = auVar67._8_4_;
  auVar95 = minps(auVar87,auVar67);
  auVar96._0_8_ = CONCAT44((uint)fVar105 & auVar111._4_4_,(uint)fVar92 & auVar111._0_4_);
  auVar96._8_4_ = (uint)fVar106 & auVar111._8_4_;
  auVar96._12_4_ = (uint)fVar107 & auVar111._12_4_;
  auVar68._8_4_ = auVar96._8_4_;
  auVar68._0_8_ = auVar96._0_8_;
  auVar68._12_4_ = auVar96._12_4_;
  auVar68 = auVar68 | auVar53;
  auVar112._4_4_ = auVar68._0_4_;
  auVar112._0_4_ = auVar68._4_4_;
  auVar112._8_4_ = auVar68._12_4_;
  auVar112._12_4_ = auVar68._8_4_;
  auVar113 = minps(auVar112,auVar68);
  auVar69._0_8_ = auVar113._8_8_;
  auVar69._8_4_ = auVar113._0_4_;
  auVar69._12_4_ = auVar113._4_4_;
  auVar113 = minps(auVar69,auVar113);
  auVar115._0_8_ = auVar33._0_8_;
  auVar115._8_4_ = auVar33._4_4_;
  auVar115._12_4_ = auVar95._4_4_;
  auVar114._8_8_ = auVar115._8_8_;
  auVar114._0_4_ = auVar33._0_4_;
  auVar114._4_4_ = auVar95._0_4_;
  auVar34._4_4_ = auVar95._8_4_;
  auVar34._0_4_ = auVar33._8_4_;
  auVar34._8_4_ = auVar33._12_4_;
  auVar34._12_4_ = auVar95._12_4_;
  auVar33 = minps(auVar34,auVar114);
  fVar64 = auVar113._0_4_;
  fVar42 = auVar33._0_4_;
  fVar41 = auVar33._4_4_;
  auVar88._0_8_ = CONCAT44(~auVar111._4_4_,~auVar111._0_4_) & 0xff800000ff800000;
  auVar88._8_4_ = ~auVar111._8_4_ & 0xff800000;
  auVar88._12_4_ = ~auVar111._12_4_ & 0xff800000;
  auVar43 = auVar43 | auVar88;
  auVar70._4_4_ = auVar43._0_4_;
  auVar70._0_4_ = auVar43._4_4_;
  auVar70._8_4_ = auVar43._12_4_;
  auVar70._12_4_ = auVar43._8_4_;
  auVar113 = maxps(auVar70,auVar43);
  auVar79 = auVar79 | auVar88;
  auVar44._4_4_ = auVar79._0_4_;
  auVar44._0_4_ = auVar79._4_4_;
  auVar44._8_4_ = auVar79._12_4_;
  auVar44._12_4_ = auVar79._8_4_;
  auVar33 = maxps(auVar44,auVar79);
  auVar96 = auVar96 | auVar88;
  auVar80._4_4_ = auVar96._0_4_;
  auVar80._0_4_ = auVar96._4_4_;
  auVar80._8_4_ = auVar96._12_4_;
  auVar80._12_4_ = auVar96._8_4_;
  auVar95 = maxps(auVar80,auVar96);
  auVar97._0_8_ = auVar95._8_8_;
  auVar97._8_4_ = auVar95._0_4_;
  auVar97._12_4_ = auVar95._4_4_;
  auVar98 = maxps(auVar97,auVar95);
  auVar82._0_8_ = auVar113._0_8_;
  auVar82._8_4_ = auVar113._4_4_;
  auVar82._12_4_ = auVar33._4_4_;
  auVar81._8_8_ = auVar82._8_8_;
  auVar81._0_4_ = auVar113._0_4_;
  auVar81._4_4_ = auVar33._0_4_;
  auVar71._4_4_ = auVar33._8_4_;
  auVar71._0_4_ = auVar113._8_4_;
  auVar71._8_4_ = auVar113._12_4_;
  auVar71._12_4_ = auVar33._12_4_;
  auVar95 = maxps(auVar71,auVar81);
  uVar12 = -(uint)(fVar42 < 0.0);
  uVar28 = -(uint)(fVar41 < 0.0);
  uVar29 = -(uint)(fVar64 < 0.0);
  auVar93._0_4_ = ~uVar12 & (uint)fVar42;
  auVar93._4_4_ = ~uVar28 & (uint)fVar41;
  auVar93._8_4_ = ~uVar29 & (uint)fVar64;
  auVar76._0_4_ = auVar95._0_4_ & uVar12;
  auVar76._4_4_ = auVar95._4_4_ & uVar28;
  auVar76._8_4_ = auVar98._0_4_ & uVar29;
  auVar76 = auVar76 | auVar93;
  local_fb8 = auVar76._0_4_;
  local_f88 = auVar76._4_4_;
  local_fe8 = auVar76._8_4_;
  fStack_f84 = local_f88;
  fStack_f80 = local_f88;
  fStack_f7c = local_f88;
  uVar24 = (ulong)(local_f88 < 0.0) << 4 | 0x20;
  auVar122._0_4_ = local_10a8._0_4_ & auVar111._0_4_;
  auVar122._4_4_ = local_10a8._4_4_ & auVar111._4_4_;
  auVar122._8_4_ = local_10a8._8_4_ & auVar111._8_4_;
  auVar122._12_4_ = local_10a8._12_4_ & auVar111._12_4_;
  uVar27 = (ulong)(local_fe8 < 0.0) << 4 | 0x40;
  uVar25 = uVar24 ^ 0x10;
  auVar122 = auVar122 | auVar53;
  auVar99._0_8_ = CONCAT44((uint)fVar141 & auVar111._4_4_,(uint)fVar140 & auVar111._0_4_);
  auVar99._8_4_ = (uint)fVar142 & auVar111._8_4_;
  auVar99._12_4_ = (uint)fVar143 & auVar111._12_4_;
  auVar116._8_4_ = auVar99._8_4_;
  auVar116._0_8_ = auVar99._0_8_;
  auVar116._12_4_ = auVar99._12_4_;
  auVar116 = auVar116 | auVar88;
  auVar123._4_4_ = auVar116._0_4_;
  auVar123._0_4_ = auVar116._4_4_;
  auVar123._8_4_ = auVar116._12_4_;
  auVar123._12_4_ = auVar116._8_4_;
  auVar33 = maxps(auVar123,auVar116);
  auVar129._0_8_ = auVar33._8_8_;
  auVar129._8_4_ = auVar33._0_4_;
  auVar129._12_4_ = auVar33._4_4_;
  auVar77 = maxps(auVar129,auVar33);
  auVar117._0_8_ = CONCAT44((uint)fVar145 & auVar111._4_4_,(uint)fVar144 & auVar111._0_4_);
  auVar117._8_4_ = (uint)fVar146 & auVar111._8_4_;
  auVar117._12_4_ = (uint)fVar147 & auVar111._12_4_;
  auVar124._8_4_ = auVar117._8_4_;
  auVar124._0_8_ = auVar117._0_8_;
  auVar124._12_4_ = auVar117._12_4_;
  auVar124 = auVar124 | auVar88;
  auVar138._4_4_ = auVar124._0_4_;
  auVar138._0_4_ = auVar124._4_4_;
  auVar138._8_4_ = auVar124._12_4_;
  auVar138._12_4_ = auVar124._8_4_;
  auVar33 = maxps(auVar138,auVar124);
  auVar35._0_8_ = auVar33._8_8_;
  auVar35._8_4_ = auVar33._0_4_;
  auVar35._12_4_ = auVar33._4_4_;
  auVar33 = maxps(auVar35,auVar33);
  auVar125._0_8_ = CONCAT44((uint)fVar149 & auVar111._4_4_,(uint)fVar148 & auVar111._0_4_);
  auVar125._8_4_ = (uint)fVar150 & auVar111._8_4_;
  auVar125._12_4_ = (uint)fVar151 & auVar111._12_4_;
  auVar130._8_4_ = auVar125._8_4_;
  auVar130._0_8_ = auVar125._0_8_;
  auVar130._12_4_ = auVar125._12_4_;
  auVar130 = auVar130 | auVar88;
  auVar139._4_4_ = auVar130._0_4_;
  auVar139._0_4_ = auVar130._4_4_;
  auVar139._8_4_ = auVar130._12_4_;
  auVar139._12_4_ = auVar130._8_4_;
  auVar113 = maxps(auVar139,auVar130);
  auVar131._0_8_ = auVar113._8_8_;
  auVar131._8_4_ = auVar113._0_4_;
  auVar131._12_4_ = auVar113._4_4_;
  auVar132 = maxps(auVar131,auVar113);
  auVar99 = auVar99 | auVar53;
  auVar133._4_4_ = auVar99._0_4_;
  auVar133._0_4_ = auVar99._4_4_;
  auVar133._8_4_ = auVar99._12_4_;
  auVar133._12_4_ = auVar99._8_4_;
  auVar113 = minps(auVar133,auVar99);
  auVar100._0_8_ = auVar113._8_8_;
  auVar100._8_4_ = auVar113._0_4_;
  auVar100._12_4_ = auVar113._4_4_;
  auVar65 = minps(auVar100,auVar113);
  auVar117 = auVar117 | auVar53;
  auVar134._4_4_ = auVar117._0_4_;
  auVar134._0_4_ = auVar117._4_4_;
  auVar134._8_4_ = auVar117._12_4_;
  auVar134._12_4_ = auVar117._8_4_;
  auVar113 = minps(auVar134,auVar117);
  auVar118._0_8_ = auVar113._8_8_;
  auVar118._8_4_ = auVar113._0_4_;
  auVar118._12_4_ = auVar113._4_4_;
  auVar119 = minps(auVar118,auVar113);
  auVar125 = auVar125 | auVar53;
  auVar54._4_4_ = auVar125._0_4_;
  auVar54._0_4_ = auVar125._4_4_;
  auVar54._8_4_ = auVar125._12_4_;
  auVar54._12_4_ = auVar125._8_4_;
  auVar113 = minps(auVar54,auVar125);
  auVar101._0_8_ = auVar113._8_8_;
  auVar101._8_4_ = auVar113._0_4_;
  auVar101._12_4_ = auVar113._4_4_;
  auVar113 = minps(auVar101,auVar113);
  auVar52._0_4_ = ~uVar12 & auVar65._0_4_;
  auVar52._4_4_ = ~uVar28 & auVar119._0_4_;
  auVar52._8_4_ = ~uVar29 & auVar113._0_4_;
  auVar94._0_4_ = ~uVar12 & auVar77._0_4_;
  auVar94._4_4_ = ~uVar28 & auVar33._0_4_;
  auVar94._8_4_ = ~uVar29 & auVar132._0_4_;
  auVar31._0_4_ = auVar77._0_4_ & uVar12;
  auVar31._4_4_ = auVar33._0_4_ & uVar28;
  auVar31._8_4_ = auVar132._0_4_ & uVar29;
  auVar31 = auVar31 | auVar52;
  auVar108._0_4_ = auVar65._0_4_ & uVar12;
  auVar108._4_4_ = auVar119._0_4_ & uVar28;
  auVar108._8_4_ = auVar113._0_4_ & uVar29;
  auVar108 = auVar108 | auVar94;
  auVar102._0_4_ = auVar111._0_4_ & local_10b8._0_4_;
  auVar102._4_4_ = auVar111._4_4_ & local_10b8._4_4_;
  auVar102._8_4_ = auVar111._8_4_ & local_10b8._8_4_;
  auVar102._12_4_ = auVar111._12_4_ & local_10b8._12_4_;
  _local_11c8 = auVar102 | auVar88;
  auVar55._4_4_ = local_11c8._0_4_;
  auVar55._0_4_ = local_11c8._4_4_;
  auVar55._8_4_ = local_11c8._12_4_;
  auVar55._12_4_ = local_11c8._8_4_;
  auVar33 = maxps(auVar55,_local_11c8);
  auVar9._4_8_ = local_11c8._8_8_;
  auVar9._0_4_ = auVar33._4_4_;
  auVar103._0_8_ = auVar9._0_8_ << 0x20;
  auVar103._8_4_ = auVar33._8_4_;
  auVar103._12_4_ = auVar33._12_4_;
  auVar51._8_8_ = auVar33._8_8_;
  auVar51._0_8_ = auVar103._8_8_;
  auVar89._4_4_ = auVar122._0_4_;
  auVar89._0_4_ = auVar122._4_4_;
  auVar89._8_4_ = auVar122._12_4_;
  auVar89._12_4_ = auVar122._8_4_;
  auVar113 = minps(auVar89,auVar122);
  if (auVar33._8_4_ <= auVar33._0_4_) {
    auVar51._0_4_ = auVar33._0_4_;
  }
  local_ff8 = (float)(~uVar12 & auVar95._0_4_ | (uint)fVar42 & uVar12);
  local_1018 = (float)(~uVar28 & auVar95._4_4_ | (uint)fVar41 & uVar28);
  local_1038 = (float)(~uVar29 & auVar98._0_4_ | (uint)fVar64 & uVar29);
  local_fc8 = auVar108._0_4_ * local_fb8;
  local_fd8 = auVar108._4_4_ * local_f88;
  fStack_f90 = auVar108._8_4_ * local_fe8;
  local_1008 = auVar31._0_4_ * local_ff8;
  fVar42 = auVar31._4_4_ * local_1018;
  fStack_1164 = auVar31._8_4_ * local_1038;
  uVar19 = (ulong)(local_fb8 < 0.0) * 0x10;
  uVar14 = *(ulong *)&pAVar6[1].bounds.bounds0.lower.field_0;
  stack[0].ptr.ptr = uVar14;
  stack[0].dist = 0;
  fStack_fb4 = local_fb8;
  fStack_fb0 = local_fb8;
  fStack_fac = local_fb8;
  fStack_fc4 = local_fc8;
  fStack_fc0 = local_fc8;
  fStack_fbc = local_fc8;
  fStack_fd4 = local_fd8;
  fStack_fd0 = local_fd8;
  fStack_fcc = local_fd8;
  fStack_fe4 = local_fe8;
  fStack_fe0 = local_fe8;
  fStack_fdc = local_fe8;
  local_f98._4_4_ = fStack_f90;
  local_f98._0_4_ = fStack_f90;
  fStack_f8c = fStack_f90;
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  fStack_1014 = local_1018;
  fStack_1010 = local_1018;
  fStack_100c = local_1018;
  uVar84 = auVar113._0_4_;
  auVar90._8_4_ = auVar113._8_4_;
  auVar56._4_4_ = uVar84;
  auVar56._0_4_ = uVar84;
  auVar56._8_4_ = uVar84;
  auVar56._12_4_ = uVar84;
  auVar90._4_4_ = auVar90._8_4_;
  auVar90._0_4_ = auVar90._8_4_;
  auVar90._12_4_ = auVar90._8_4_;
  local_fa8 = minps(auVar90,auVar56);
  local_1028._4_4_ = fVar42;
  local_1028._0_4_ = fVar42;
  fStack_1020 = fVar42;
  fStack_101c = fVar42;
  fStack_1034 = local_1038;
  fStack_1030 = local_1038;
  fStack_102c = local_1038;
  local_1168 = fStack_1164;
  fStack_1160 = fStack_1164;
  fStack_115c = fStack_1164;
  pSVar26 = stack + 1;
  auVar33 = _DAT_01feb9f0;
  do {
    local_1158._4_4_ = auVar51._0_4_;
    local_1158._0_4_ = local_1158._4_4_;
    local_1158._8_4_ = local_1158._4_4_;
    local_1158._12_4_ = local_1158._4_4_;
LAB_0020ea44:
    do {
      do {
        if (pSVar26 == stack) {
          uVar17 = uVar17 & ~CONCAT44((int)((ulong)lVar7 >> 0x20),uVar13);
          if (uVar17 == 0) {
            return;
          }
          goto LAB_0020e681;
        }
        fVar42 = (float)pSVar26[-1].dist;
        pSVar26 = pSVar26 + -1;
        auVar36._4_4_ = fVar42;
        auVar36._0_4_ = fVar42;
        auVar36._8_4_ = fVar42;
        auVar36._12_4_ = fVar42;
        auVar45._4_4_ = -(uint)(fVar42 < (float)local_11c8._4_4_);
        auVar45._0_4_ = -(uint)(fVar42 < (float)local_11c8._0_4_);
        auVar45._8_4_ = -(uint)(fVar42 < fStack_11c0);
        auVar45._12_4_ = -(uint)(fVar42 < fStack_11bc);
        uVar12 = movmskps((int)uVar14,auVar45);
        uVar14 = (ulong)uVar12;
      } while (uVar12 == 0);
      sVar23 = (pSVar26->ptr).ptr;
      while ((sVar23 & 8) == 0) {
        pfVar2 = (float *)(sVar23 + 0x20 + uVar19);
        auVar46._0_4_ = *pfVar2 * local_fb8 - local_fc8;
        auVar46._4_4_ = pfVar2[1] * fStack_fb4 - fStack_fc4;
        auVar46._8_4_ = pfVar2[2] * fStack_fb0 - fStack_fc0;
        auVar46._12_4_ = pfVar2[3] * fStack_fac - fStack_fbc;
        pfVar2 = (float *)(sVar23 + 0x20 + uVar24);
        auVar57._0_4_ = *pfVar2 * local_f88 - local_fd8;
        auVar57._4_4_ = pfVar2[1] * fStack_f84 - fStack_fd4;
        auVar57._8_4_ = pfVar2[2] * fStack_f80 - fStack_fd0;
        auVar57._12_4_ = pfVar2[3] * fStack_f7c - fStack_fcc;
        auVar113 = maxps(auVar46,auVar57);
        pfVar2 = (float *)(sVar23 + 0x20 + uVar27);
        auVar58._0_4_ = *pfVar2 * local_fe8 - (float)local_f98._0_4_;
        auVar58._4_4_ = pfVar2[1] * fStack_fe4 - (float)local_f98._4_4_;
        auVar58._8_4_ = pfVar2[2] * fStack_fe0 - fStack_f90;
        auVar58._12_4_ = pfVar2[3] * fStack_fdc - fStack_f8c;
        auVar95 = maxps(auVar58,local_fa8);
        fmin.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar113,auVar95);
        pfVar2 = (float *)(sVar23 + 0x20 + (uVar19 ^ 0x10));
        auVar59._0_4_ = *pfVar2 * local_ff8 - local_1008;
        auVar59._4_4_ = pfVar2[1] * fStack_ff4 - fStack_1004;
        auVar59._8_4_ = pfVar2[2] * fStack_ff0 - fStack_1000;
        auVar59._12_4_ = pfVar2[3] * fStack_fec - fStack_ffc;
        pfVar2 = (float *)(sVar23 + 0x20 + uVar25);
        auVar72._0_4_ = *pfVar2 * local_1018 - (float)local_1028._0_4_;
        auVar72._4_4_ = pfVar2[1] * fStack_1014 - (float)local_1028._4_4_;
        auVar72._8_4_ = pfVar2[2] * fStack_1010 - fStack_1020;
        auVar72._12_4_ = pfVar2[3] * fStack_100c - fStack_101c;
        auVar113 = minps(auVar59,auVar72);
        pfVar2 = (float *)(sVar23 + 0x20 + (uVar27 ^ 0x10));
        auVar73._0_4_ = *pfVar2 * local_1038 - local_1168;
        auVar73._4_4_ = pfVar2[1] * fStack_1034 - fStack_1164;
        auVar73._8_4_ = pfVar2[2] * fStack_1030 - fStack_1160;
        auVar73._12_4_ = pfVar2[3] * fStack_102c - fStack_115c;
        auVar95 = minps(auVar73,local_1158);
        auVar113 = minps(auVar113,auVar95);
        auVar47._4_4_ = -(uint)(fmin.field_0._4_4_ <= auVar113._4_4_);
        auVar47._0_4_ = -(uint)(fmin.field_0._0_4_ <= auVar113._0_4_);
        auVar47._8_4_ = -(uint)(fmin.field_0._8_4_ <= auVar113._8_4_);
        auVar47._12_4_ = -(uint)(fmin.field_0._12_4_ <= auVar113._12_4_);
        uVar12 = movmskps((int)uVar25,auVar47);
        uVar14 = (ulong)uVar12;
        if (uVar12 == 0) {
          bVar11 = false;
        }
        else {
          uVar20 = (ulong)(byte)uVar12;
          uVar22 = 0;
          uVar15 = 8;
          auVar36 = auVar33;
          do {
            lVar8 = 0;
            if (uVar20 != 0) {
              for (; (uVar20 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
              }
            }
            fVar42 = *(float *)(sVar23 + 0x20 + lVar8 * 4);
            fVar41 = *(float *)(sVar23 + 0x30 + lVar8 * 4);
            fVar64 = *(float *)(sVar23 + 0x40 + lVar8 * 4);
            fVar3 = *(float *)(sVar23 + 0x50 + lVar8 * 4);
            auVar48._0_8_ = CONCAT44((fVar42 - fVar141) * fVar153,(fVar42 - fVar140) * fVar152);
            auVar48._8_4_ = (fVar42 - fVar142) * fVar154;
            auVar48._12_4_ = (fVar42 - fVar143) * fVar155;
            auVar60._0_8_ = CONCAT44((fVar64 - fVar145) * fVar135,(fVar64 - fVar144) * fVar128);
            auVar60._8_4_ = (fVar64 - fVar146) * fVar136;
            auVar60._12_4_ = (fVar64 - fVar147) * fVar137;
            fVar42 = *(float *)(sVar23 + 0x60 + lVar8 * 4);
            auVar91._0_8_ = CONCAT44((fVar42 - fVar149) * fVar105,(fVar42 - fVar148) * fVar92);
            auVar91._8_4_ = (fVar42 - fVar150) * fVar106;
            auVar91._12_4_ = (fVar42 - fVar151) * fVar107;
            auVar74._0_4_ = (fVar41 - fVar140) * fVar152;
            auVar74._4_4_ = (fVar41 - fVar141) * fVar153;
            auVar74._8_4_ = (fVar41 - fVar142) * fVar154;
            auVar74._12_4_ = (fVar41 - fVar143) * fVar155;
            auVar83._0_4_ = (fVar3 - fVar144) * fVar128;
            auVar83._4_4_ = (fVar3 - fVar145) * fVar135;
            auVar83._8_4_ = (fVar3 - fVar146) * fVar136;
            auVar83._12_4_ = (fVar3 - fVar147) * fVar137;
            fVar42 = *(float *)(sVar23 + 0x70 + lVar8 * 4);
            auVar104._0_4_ = (fVar42 - fVar148) * fVar92;
            auVar104._4_4_ = (fVar42 - fVar149) * fVar105;
            auVar104._8_4_ = (fVar42 - fVar150) * fVar106;
            auVar104._12_4_ = (fVar42 - fVar151) * fVar107;
            auVar120._8_4_ = auVar48._8_4_;
            auVar120._0_8_ = auVar48._0_8_;
            auVar120._12_4_ = auVar48._12_4_;
            auVar113 = minps(auVar120,auVar74);
            auVar126._8_4_ = auVar60._8_4_;
            auVar126._0_8_ = auVar60._0_8_;
            auVar126._12_4_ = auVar60._12_4_;
            auVar95 = minps(auVar126,auVar83);
            auVar113 = maxps(auVar113,auVar95);
            auVar127._8_4_ = auVar91._8_4_;
            auVar127._0_8_ = auVar91._0_8_;
            auVar127._12_4_ = auVar91._12_4_;
            auVar95 = minps(auVar127,auVar104);
            auVar98 = maxps(auVar113,auVar95);
            auVar113 = maxps(auVar48,auVar74);
            auVar95 = maxps(auVar60,auVar83);
            auVar113 = minps(auVar113,auVar95);
            auVar95 = maxps(auVar91,auVar104);
            auVar113 = minps(auVar113,auVar95);
            auVar95 = maxps(auVar98,auVar122);
            auVar113 = minps(auVar113,_local_11c8);
            auVar121._4_4_ = -(uint)(auVar95._4_4_ <= auVar113._4_4_);
            auVar121._0_4_ = -(uint)(auVar95._0_4_ <= auVar113._0_4_);
            auVar121._8_4_ = -(uint)(auVar95._8_4_ <= auVar113._8_4_);
            auVar121._12_4_ = -(uint)(auVar95._12_4_ <= auVar113._12_4_);
            uVar12 = movmskps((int)valid_i,auVar121);
            valid_i = (vint<4> *)(ulong)uVar12;
            uVar14 = uVar15;
            if (uVar12 != 0) {
              fVar42 = fmin.field_0.v[lVar8];
              auVar113 = ZEXT416((uint)fVar42);
              uVar14 = *(ulong *)(sVar23 + lVar8 * 8);
              auVar75._4_4_ = -(uint)(fVar42 < auVar36._4_4_);
              auVar75._0_4_ = -(uint)(fVar42 < auVar36._0_4_);
              auVar75._8_4_ = -(uint)(fVar42 < auVar36._8_4_);
              auVar75._12_4_ = -(uint)(fVar42 < auVar36._12_4_);
              uVar12 = movmskps(uVar12,auVar75);
              valid_i = (vint<4> *)(ulong)uVar12;
              if (uVar12 == 0) {
                (pSVar26->ptr).ptr = uVar14;
                uVar14 = uVar15;
                auVar37 = auVar36;
              }
              else {
                if (uVar15 == 8) {
                  auVar36._8_4_ = fVar42;
                  auVar36._0_8_ = CONCAT44(fVar42,fVar42);
                  auVar36._12_4_ = fVar42;
                  goto LAB_0020ec4d;
                }
                (pSVar26->ptr).ptr = uVar15;
                auVar37._8_4_ = fVar42;
                auVar37._0_8_ = CONCAT44(fVar42,fVar42);
                auVar37._12_4_ = fVar42;
                auVar113 = auVar36;
              }
              auVar36 = auVar37;
              uVar22 = uVar22 + 1;
              pSVar26->dist = auVar113._0_4_;
              pSVar26 = pSVar26 + 1;
            }
LAB_0020ec4d:
            local_11b8.context = (RTCRayQueryContext *)(uVar20 - 1);
            uVar20 = uVar20 & (ulong)local_11b8.context;
            uVar15 = uVar14;
          } while (uVar20 != 0);
          sVar23 = uVar14;
          if (uVar14 == 8) {
            bVar11 = false;
          }
          else {
            bVar11 = true;
            if (1 < uVar22) {
              local_11b8.context = (RTCRayQueryContext *)(pSVar26 + -2);
              valid_i = (vint<4> *)(pSVar26 + -1);
              if (pSVar26[-2].dist < pSVar26[-1].dist) {
                pSVar26[-2].dist = pSVar26[-1].dist;
                (((AccelData *)local_11b8.context)->super_RefCount)._vptr_RefCount =
                     (_func_int **)((RTCIntersectFunctionNArguments *)valid_i)->valid;
                local_11b8.valid =
                     (int *)(((AccelData *)local_11b8.context)->super_RefCount)._vptr_RefCount;
                ((RTCIntersectFunctionNArguments *)valid_i)->valid = local_11b8.valid;
                local_11b8.geometryUserPtr._0_4_ =
                     (((AccelData *)local_11b8.context)->super_RefCount).refCounter;
                pSVar26[-1].dist = (uint)local_11b8.geometryUserPtr;
              }
              if (uVar22 != 2) {
                pSVar1 = pSVar26 + -3;
                if (pSVar26[-3].dist < pSVar26[-1].dist) {
                  SVar4 = *pSVar1;
                  pSVar26[-3].dist = pSVar26[-1].dist;
                  (pSVar1->ptr).ptr = (size_t)((RTCIntersectFunctionNArguments *)valid_i)->valid;
                  local_11b8.valid = (int *)SVar4.ptr.ptr;
                  ((RTCIntersectFunctionNArguments *)valid_i)->valid = local_11b8.valid;
                  local_11b8.geometryUserPtr._0_4_ = SVar4.dist;
                  pSVar26[-1].dist = (uint)local_11b8.geometryUserPtr;
                }
                valid_i = (vint<4> *)(ulong)pSVar26[-3].dist;
                if (pSVar26[-3].dist < pSVar26[-2].dist) {
                  SVar4 = *pSVar1;
                  pSVar26[-3].dist = pSVar26[-2].dist;
                  (pSVar1->ptr).ptr =
                       (size_t)(((AccelData *)local_11b8.context)->super_RefCount)._vptr_RefCount;
                  local_11b8.valid = (int *)SVar4.ptr.ptr;
                  (((AccelData *)local_11b8.context)->super_RefCount)._vptr_RefCount =
                       (_func_int **)local_11b8.valid;
                  local_11b8.geometryUserPtr._0_4_ = SVar4.dist;
                  valid_i = (vint<4> *)(ulong)(uint)local_11b8.geometryUserPtr;
                  pSVar26[-2].dist = (uint)local_11b8.geometryUserPtr;
                }
              }
            }
          }
        }
        if (!bVar11) goto LAB_0020ea44;
      }
      auVar61._4_4_ = -(uint)(auVar36._4_4_ < (float)local_11c8._4_4_);
      auVar61._0_4_ = -(uint)(auVar36._0_4_ < (float)local_11c8._0_4_);
      auVar61._8_4_ = -(uint)(auVar36._8_4_ < fStack_11c0);
      auVar61._12_4_ = -(uint)(auVar36._12_4_ < fStack_11bc);
      uVar12 = movmskps((int)uVar14,auVar61);
      uVar14 = (ulong)uVar12;
      if (uVar12 == 0) goto LAB_0020ea44;
      pGVar16 = (Geometry *)((ulong)((uint)sVar23 & 0xf) - 8);
      local_1188 = pGVar16;
      if (pGVar16 != (Geometry *)0x0) {
        pGVar21 = (Geometry *)0x0;
        local_1048 = auVar61;
        do {
          local_11b8.geomID = *(uint *)((sVar23 & 0xfffffffffffffff0) + (long)pGVar21 * 8);
          valid_i = (vint<4> *)(ulong)local_11b8.geomID;
          local_1188 = (context->scene->geometries).items[(long)valid_i].ptr;
          uVar12 = local_1188->mask;
          auVar38._0_4_ = -(uint)((uVar12 & *(uint *)(ray + 0x90)) == 0);
          auVar38._4_4_ = -(uint)((uVar12 & *(uint *)(ray + 0x94)) == 0);
          auVar38._8_4_ = -(uint)((uVar12 & *(uint *)(ray + 0x98)) == 0);
          auVar38._12_4_ = -(uint)((uVar12 & *(uint *)(ray + 0x9c)) == 0);
          fmin.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(~auVar38 & auVar61);
          uVar12 = movmskps((int)local_11b8.context,(undefined1  [16])fmin.field_0);
          local_11b8.context = (RTCRayQueryContext *)(ulong)uVar12;
          if (uVar12 != 0) {
            local_11b8.primID = *(uint *)((sVar23 & 0xfffffffffffffff0) + 4 + (long)pGVar21 * 8);
            local_11b8.geometryUserPtr = local_1188->userPtr;
            local_11b8.valid = (int *)&fmin;
            local_11b8.context = context->user;
            local_11b8.N = 4;
            local_1180 = 0;
            local_1178 = context->args;
            pp_Var18 = (_func_int **)local_1178->intersect;
            if (pp_Var18 == (_func_int **)0x0) {
              pp_Var18 = local_1188[1].super_RefCount._vptr_RefCount;
            }
            valid_i = (vint<4> *)&local_11b8;
            local_11b8.rayhit = (RTCRayHitN *)ray;
            local_1188 = (Geometry *)(*(code *)pp_Var18)((RTCIntersectFunctionNArguments *)valid_i);
            auVar61 = local_1048;
            auVar33 = _DAT_01feb9f0;
            fVar140 = local_1058;
            fVar141 = fStack_1054;
            fVar142 = fStack_1050;
            fVar143 = fStack_104c;
            fVar144 = local_1068;
            fVar145 = fStack_1064;
            fVar146 = fStack_1060;
            fVar147 = fStack_105c;
            fVar148 = local_1078;
            fVar149 = fStack_1074;
            fVar150 = fStack_1070;
            fVar151 = fStack_106c;
            fVar92 = local_1088;
            fVar105 = fStack_1084;
            fVar106 = fStack_1080;
            fVar107 = fStack_107c;
            fVar152 = local_1098;
            fVar153 = fStack_1094;
            fVar154 = fStack_1090;
            fVar155 = fStack_108c;
          }
          pGVar21 = (Geometry *)((long)&(pGVar21->super_RefCount)._vptr_RefCount + 1);
        } while (pGVar16 != pGVar21);
      }
      uVar28 = auVar61._0_4_;
      auVar49._0_4_ = -(uint)(*(float *)(ray + 0x80) < (float)local_11c8._0_4_) & uVar28;
      uVar29 = auVar61._4_4_;
      auVar49._4_4_ = -(uint)(*(float *)(ray + 0x84) < (float)local_11c8._4_4_) & uVar29;
      uVar30 = auVar61._8_4_;
      auVar49._8_4_ = -(uint)(*(float *)(ray + 0x88) < fStack_11c0) & uVar30;
      uVar63 = auVar61._12_4_;
      auVar49._12_4_ = -(uint)(*(float *)(ray + 0x8c) < fStack_11bc) & uVar63;
      uVar12 = movmskps((int)local_1188,auVar49);
      uVar14 = (ulong)uVar12;
    } while (uVar12 == 0);
    auVar39._0_4_ = (uint)*(float *)(ray + 0x80) & uVar28;
    auVar39._4_4_ = (uint)*(float *)(ray + 0x84) & uVar29;
    auVar39._8_4_ = (uint)*(float *)(ray + 0x88) & uVar30;
    auVar39._12_4_ = (uint)*(float *)(ray + 0x8c) & uVar63;
    auVar62._0_4_ = ~uVar28 & local_11c8._0_4_;
    auVar62._4_4_ = ~uVar29 & local_11c8._4_4_;
    auVar62._8_4_ = ~uVar30 & (uint)fStack_11c0;
    auVar62._12_4_ = ~uVar63 & (uint)fStack_11bc;
    _local_11c8 = auVar62 | auVar39;
    auVar40._4_4_ = local_11c8._0_4_;
    auVar40._0_4_ = local_11c8._4_4_;
    auVar40._8_4_ = local_11c8._12_4_;
    auVar40._12_4_ = local_11c8._8_4_;
    auVar113 = maxps(auVar40,_local_11c8);
    auVar10._4_8_ = auVar49._8_8_;
    auVar10._0_4_ = auVar113._4_4_;
    auVar50._0_8_ = auVar10._0_8_ << 0x20;
    auVar50._8_4_ = auVar113._8_4_;
    auVar50._12_4_ = auVar113._12_4_;
    auVar51._8_8_ = auVar113._8_8_;
    auVar51._0_8_ = auVar50._8_8_;
    if (auVar113._8_4_ <= auVar113._0_4_) {
      auVar51._0_4_ = auVar113._0_4_;
    }
  } while( true );
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_castsi128_ps(_mm_cmpeq_epi32(a, b)); }